

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_debug.c
# Opt level: O2

uint64_t debug_get_flags_option(char *name,debug_named_value *flags,uint64_t dfault)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  char *pcVar6;
  char cVar7;
  debug_named_value *pdVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *__s1;
  ulong local_50;
  
  pcVar3 = os_get_option(name);
  if (pcVar3 != (char *)0x0) {
    iVar1 = strcmp(pcVar3,"help");
    if (iVar1 != 0) {
      local_50 = 0;
LAB_001eb0a0:
      pcVar10 = flags->name;
      dfault = local_50;
      if (pcVar10 != (char *)0x0) {
        cVar7 = *pcVar3;
        if (cVar7 != '\0') {
          iVar1 = strcmp(pcVar3,"all");
          if (iVar1 != 0) {
            sVar4 = strlen(pcVar10);
            pcVar11 = pcVar3 + -(sVar4 & 0xffffffff);
            __s1 = pcVar3;
            pcVar12 = pcVar3;
            do {
              pcVar12 = pcVar12 + 1;
              if (cVar7 == '\0') {
                if (__s1 != pcVar11) goto LAB_001eb16c;
LAB_001eb111:
                iVar1 = bcmp(__s1,pcVar10,sVar4 & 0xffffffff);
                if ((cVar7 == '\0') || (pcVar6 = pcVar12, iVar1 == 0)) goto LAB_001eb13d;
              }
              else {
                ppuVar5 = __ctype_b_loc();
                pcVar6 = __s1;
                if (((cVar7 != '_') && (((*ppuVar5)[cVar7] & 8) == 0)) &&
                   (pcVar6 = pcVar12, __s1 == pcVar11)) goto LAB_001eb111;
              }
              cVar7 = *pcVar12;
              pcVar11 = pcVar11 + 1;
              __s1 = pcVar6;
            } while( true );
          }
          goto LAB_001eb14d;
        }
        goto LAB_001eb16c;
      }
      goto LAB_001eb20b;
    }
    uVar9 = 0;
    _debug_printf("%s: help for %s:\n","debug_get_flags_option",name);
    pdVar8 = flags;
    while( true ) {
      if (pdVar8->name == (char *)0x0) break;
      sVar4 = strlen(pdVar8->name);
      uVar2 = (uint)sVar4;
      if (sVar4 < uVar9) {
        uVar2 = (uint)uVar9;
      }
      pdVar8 = pdVar8 + 1;
      uVar9 = (ulong)uVar2;
    }
    for (; flags->name != (char *)0x0; flags = flags + 1) {
      pcVar3 = flags->desc;
      pcVar10 = " ";
      if (pcVar3 == (char *)0x0) {
        pcVar10 = "";
        pcVar3 = "";
      }
      _debug_printf("| %*s [0x%0*lx]%s%s\n",uVar9,flags->name,0x10,flags->value,pcVar10,pcVar3);
    }
  }
LAB_001eb20b:
  debug_get_option_should_print();
  return dfault;
LAB_001eb13d:
  if (iVar1 == 0) {
LAB_001eb14d:
    local_50 = local_50 | flags->value;
  }
LAB_001eb16c:
  flags = flags + 1;
  goto LAB_001eb0a0;
}

Assistant:

uint64_t
debug_get_flags_option(const char *name,
                       const struct debug_named_value *flags,
                       uint64_t dfault)
{
   uint64_t result;
   const char *str;
   const struct debug_named_value *orig = flags;
   unsigned namealign = 0;

   str = os_get_option(name);
   if (!str)
      result = dfault;
   else if (!strcmp(str, "help")) {
      result = dfault;
      _debug_printf("%s: help for %s:\n", __FUNCTION__, name);
      for (; flags->name; ++flags)
         namealign = MAX2(namealign, strlen(flags->name));
      for (flags = orig; flags->name; ++flags)
         _debug_printf("| %*s [0x%0*"PRIx64"]%s%s\n", namealign, flags->name,
                      (int)sizeof(uint64_t)*CHAR_BIT/4, flags->value,
                      flags->desc ? " " : "", flags->desc ? flags->desc : "");
   }
   else {
      result = 0;
      while (flags->name) {
	 if (str_has_option(str, flags->name))
	    result |= flags->value;
	 ++flags;
      }
   }

   if (debug_get_option_should_print()) {
      if (str) {
         debug_printf("%s: %s = 0x%"PRIx64" (%s)\n",
                      __FUNCTION__, name, result, str);
      } else {
         debug_printf("%s: %s = 0x%"PRIx64"\n", __FUNCTION__, name, result);
      }
   }

   return result;
}